

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT16_Unmarshal(&target->tag,buffer,size);
  if ((TVar1 == 0) && ((target->tag == 0x8025 || (TVar1 = 0x97, target->tag == 0x8023)))) {
    TVar1 = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1);
    if (TVar1 == 0) {
      TVar1 = TPM2B_DIGEST_Unmarshal(&target->digest,buffer,size);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMT_TK_AUTH_Unmarshal(TPMT_TK_AUTH *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ST_Unmarshal((TPM_ST *)&(target->tag), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( ((target->tag) != TPM_ST_AUTH_SIGNED)
     && ((target->tag) != TPM_ST_AUTH_SECRET))
        return TPM_RC_TAG;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->digest), buffer, size);
    return result;
}